

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::AssertHashEqConsistent<long>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
           *this,long *key)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 *puVar9;
  ushort uVar10;
  slot_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + *key;
    uVar12 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar13 = (this->settings_).
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar13 == 1) {
      psVar11 = soo_slot(this);
      lVar1 = *key;
      if ((*psVar11 == lVar1) &&
         (auVar6._8_8_ = 0, auVar6._0_8_ = (long)&hash_internal::MixingHashState::kSeed + *psVar11,
         uVar12 != (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_00226f90:
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar1;
        if (uVar12 != (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8) ^
                      SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0))) {
          __assert_fail("hash_of_arg == once_more_hash_arg && \"hash is not idempotent.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf10,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::AssertHashEqConsistent(const long &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                       );
        }
        __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf1b,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::AssertHashEqConsistent(const long &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                     );
      }
    }
    else {
      if (uVar13 == 0) {
        __assert_fail("!kEnabled || cap >= kCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb37,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                     );
      }
      if (uVar13 < 0x11) {
        psVar11 = slot_array(this);
        uVar13 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar14 = (undefined1 (*) [16])
                   (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar13 < 0xf) {
          if (8 < uVar13) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = long, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar13 = *(ulong *)(*pauVar14 + uVar13) & 0x8080808080808080;
          if (uVar13 != 0x8080808080808080) {
            uVar13 = uVar13 ^ 0x8080808080808080;
            lVar1 = *key;
            do {
              lVar3 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              lVar3 = *(long *)((long)psVar11 + ((ulong)((uint)lVar3 & 0xfffffff8) - 8));
              if ((lVar3 == lVar1) &&
                 (auVar5._8_8_ = 0,
                 auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar3,
                 uVar12 != (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                           SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_00226f90;
              uVar13 = uVar13 & uVar13 - 1;
            } while (uVar13 != 0);
          }
        }
        else {
          uVar13 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar13) {
            uVar13 = uVar13 >> 1;
            lVar1 = *key;
            while( true ) {
              auVar4 = *pauVar14;
              uVar15 = (uint)(ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar4[0xf] >> 7) << 0xf);
              if (uVar15 != 0xffff) {
                uVar15 = ~uVar15;
                do {
                  uVar2 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                    }
                  }
                  if ((char)(*pauVar14)[uVar2] < '\0') {
                    __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x764,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = long, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                                 );
                  }
                  if ((psVar11[uVar2] == lVar1) &&
                     (auVar7._8_8_ = 0,
                     auVar7._0_8_ = (long)&hash_internal::MixingHashState::kSeed + psVar11[uVar2],
                     uVar12 != (SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8) ^
                               SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_00226f90;
                  uVar13 = uVar13 - 1;
                  uVar10 = (ushort)(uVar15 - 1) & (ushort)uVar15;
                  uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar10);
                } while (uVar10 != 0);
              }
              if (uVar13 == 0) break;
              psVar11 = psVar11 + 0x10;
              puVar9 = *pauVar14;
              pauVar14 = pauVar14 + 1;
              if (puVar9[0xf] == -1) {
                __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x76b,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = long, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

size_t capacity() const {
    const size_t cap = common().capacity();
    // Compiler complains when using functions in assume so use local variables.
    ABSL_ATTRIBUTE_UNUSED static constexpr bool kEnabled = SooEnabled();
    ABSL_ATTRIBUTE_UNUSED static constexpr size_t kCapacity = SooCapacity();
    ABSL_ASSUME(!kEnabled || cap >= kCapacity);
    return cap;
  }